

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_exch.c
# Opt level: O0

void * kdf_scrypt_newctx(void *provctx)

{
  void *pvVar1;
  char *in_stack_00000008;
  
  pvVar1 = kdf_newctx(in_stack_00000008,provctx);
  return pvVar1;
}

Assistant:

static int kdf_init(void *vpkdfctx, void *vkdf, const OSSL_PARAM params[])
{
    PROV_KDF_CTX *pkdfctx = (PROV_KDF_CTX *)vpkdfctx;

    if (!ossl_prov_is_running()
            || pkdfctx == NULL
            || vkdf == NULL
            || !ossl_kdf_data_up_ref(vkdf))
        return 0;
    pkdfctx->kdfdata = vkdf;

    return kdf_set_ctx_params(pkdfctx, params);
}